

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall
embree::TutorialApplication::motionFunc
          (TutorialApplication *this,GLFWwindow *window,double x,double y)

{
  int iVar1;
  float fVar2;
  ImGuiIO *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar17;
  float fVar18;
  
  ImGui_ImplGlfw_CursorPosCallback(window,x,y);
  pIVar3 = ImGui::GetIO();
  if (pIVar3->WantCaptureMouse == false) {
    fVar4 = (float)(this->clickX - x);
    fVar7 = (float)(this->clickY - y);
    this->clickX = x;
    this->clickY = y;
    iVar1 = this->mouseMode;
    if (iVar1 == 4) {
      Camera::rotate(&this->camera,fVar4 * -0.005,fVar7 * 0.005);
      return;
    }
    if (iVar1 == 3) {
      fVar4 = powf(0.99,-fVar7);
      fVar7 = (this->camera).to.field_0.m128[0] - (this->camera).from.field_0.m128[0];
      fVar5 = (this->camera).to.field_0.m128[1] - (this->camera).from.field_0.m128[1];
      fVar6 = (this->camera).to.field_0.m128[2] - (this->camera).from.field_0.m128[2];
      fVar7 = fVar6 * fVar6 + fVar5 * fVar5 + fVar7 * fVar7;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      fVar7 = (1.0 - fVar4) * fVar7;
      fVar4 = (this->camera).from.field_0.m128[0];
      fVar5 = (this->camera).from.field_0.m128[1];
      fVar6 = (this->camera).from.field_0.m128[2];
      fVar2 = (this->camera).from.field_0.m128[3];
      fVar8 = (this->camera).to.field_0.m128[0] - fVar4;
      fVar9 = (this->camera).to.field_0.m128[1] - fVar5;
      fVar10 = (this->camera).to.field_0.m128[2] - fVar6;
      fVar11 = (this->camera).to.field_0.m128[3] - fVar2;
      fVar14 = fVar9 * fVar9;
      fVar15 = fVar10 * fVar10;
      fVar16 = fVar11 * fVar11;
      fVar17 = fVar14 + fVar8 * fVar8 + fVar15;
      fVar18 = fVar14 + fVar14 + fVar16;
      fVar15 = fVar14 + fVar15 + fVar15;
      fVar16 = fVar14 + fVar16 + fVar16;
      auVar12._4_4_ = fVar18;
      auVar12._0_4_ = fVar17;
      auVar12._8_4_ = fVar15;
      auVar12._12_4_ = fVar16;
      auVar13._4_4_ = fVar18;
      auVar13._0_4_ = fVar17;
      auVar13._8_4_ = fVar15;
      auVar13._12_4_ = fVar16;
      auVar13 = rsqrtss(auVar12,auVar13);
      fVar14 = auVar13._0_4_;
      fVar14 = fVar14 * fVar14 * fVar17 * -0.5 * fVar14 + fVar14 * 1.5;
      (this->camera).from.field_0.m128[0] = fVar7 * fVar14 * fVar8 + fVar4;
      (this->camera).from.field_0.m128[1] = fVar7 * fVar14 * fVar9 + fVar5;
      (this->camera).from.field_0.m128[2] = fVar7 * fVar14 * fVar10 + fVar6;
      (this->camera).from.field_0.m128[3] = fVar7 * fVar14 * fVar11 + fVar2;
    }
    else if (iVar1 == 1) {
      Camera::rotateOrbit(&this->camera,fVar4 * -0.005,fVar7 * 0.005);
      return;
    }
  }
  return;
}

Assistant:

void TutorialApplication::motionFunc(GLFWwindow* window, double x, double y)
  {
    ImGui_ImplGlfw_CursorPosCallback(window, x, y);
    if (ImGui::GetIO().WantCaptureMouse) return;
  
    float dClickX = float(clickX - x), dClickY = float(clickY - y);
    clickX = x; clickY = y;

    switch (mouseMode) {
    case 1: camera.rotateOrbit(-0.005f*dClickX,0.005f*dClickY); break;
    case 2: break;
    case 3: camera.dolly(-dClickY); break;
    case 4: camera.rotate(-0.005f*dClickX,0.005f*dClickY); break;
    }
  }